

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

ENetAcknowledgement *
enet_peer_queue_acknowledgement(ENetPeer *peer,ENetProtocol *command,uint16_t sentTime)

{
  ushort uVar1;
  _ENetListNode *p_Var2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ENetListIterator result;
  ENetAcknowledgement *pEVar11;
  
  if ((ulong)(command->header).channelID < peer->channelCount) {
    uVar4 = (command->header).reliableSequenceNumber >> 0xc;
    uVar1 = *(ushort *)
             ((long)peer->channels->reliableWindows +
             (ulong)((uint)(command->header).channelID * 0x50) + 0x20);
    uVar5 = uVar1 >> 0xc;
    uVar3 = uVar4 + 0x10;
    if (uVar1 <= (command->header).reliableSequenceNumber) {
      uVar3 = uVar4;
    }
    if (uVar3 <= (ushort)(uVar5 + 8) && (ushort)(uVar5 + 7) <= uVar3) {
      return (ENetAcknowledgement *)0x0;
    }
  }
  pEVar11 = (ENetAcknowledgement *)(*(code *)callbacks_0)(0x48);
  if (pEVar11 != (ENetAcknowledgement *)0x0) {
    peer->outgoingDataTotal = peer->outgoingDataTotal + 8;
    pEVar11->sentTime = (uint)sentTime;
    uVar6 = *(undefined8 *)&(command->connect).mtu;
    uVar7 = *(undefined8 *)&(command->connect).channelCount;
    uVar8 = *(undefined8 *)&(command->connect).outgoingBandwidth;
    uVar9 = *(undefined8 *)&(command->connect).packetThrottleAcceleration;
    uVar10 = *(undefined8 *)&(command->connect).connectID;
    (pEVar11->command).acknowledge = command->acknowledge;
    *(undefined8 *)((long)&pEVar11->command + 8) = uVar6;
    *(undefined8 *)((long)&pEVar11->command + 0x10) = uVar7;
    *(undefined8 *)((long)&pEVar11->command + 0x18) = uVar8;
    *(undefined8 *)((long)&pEVar11->command + 0x20) = uVar9;
    *(undefined8 *)((long)&pEVar11->command + 0x28) = uVar10;
    p_Var2 = (peer->acknowledgements).sentinel.previous;
    (pEVar11->acknowledgementList).previous = p_Var2;
    (pEVar11->acknowledgementList).next = &(peer->acknowledgements).sentinel;
    p_Var2->next = (_ENetListNode *)pEVar11;
    (peer->acknowledgements).sentinel.previous = (_ENetListNode *)pEVar11;
    return pEVar11;
  }
  pEVar11 = (ENetAcknowledgement *)(*(code *)callbacks_2)();
  return pEVar11;
}

Assistant:

ENetAcknowledgement* enet_peer_queue_acknowledgement(ENetPeer* peer, const ENetProtocol* command, uint16_t sentTime) {
	ENetAcknowledgement* acknowledgement;

	if (command->header.channelID < peer->channelCount) {
		ENetChannel* channel = &peer->channels[command->header.channelID];
		uint16_t reliableWindow = command->header.reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
		uint16_t currentWindow = channel->incomingReliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;

		if (command->header.reliableSequenceNumber < channel->incomingReliableSequenceNumber)
			reliableWindow += ENET_PEER_RELIABLE_WINDOWS;

		if (reliableWindow >= currentWindow + ENET_PEER_FREE_RELIABLE_WINDOWS - 1 && reliableWindow <= currentWindow + ENET_PEER_FREE_RELIABLE_WINDOWS)
			return NULL;
	}

	acknowledgement = (ENetAcknowledgement*)enet_malloc(sizeof(ENetAcknowledgement));

	if (acknowledgement == NULL)
		return NULL;

	peer->outgoingDataTotal += sizeof(ENetProtocolAcknowledge);
	acknowledgement->sentTime = sentTime;
	acknowledgement->command = *command;

	enet_list_insert(enet_list_end(&peer->acknowledgements), acknowledgement);

	return acknowledgement;
}